

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_NE_RANGE_Test::Body
          (iu_SyntaxTest_x_iutest_x_NE_RANGE_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int (*in_R9) [5];
  AssertionResult iutest_ar;
  int b [5];
  int a [5];
  allocator<char> local_231;
  AssertionResult local_230;
  AssertionHelper local_208;
  int local_1d8 [8];
  char local_1b8 [32];
  undefined1 local_198 [392];
  
  local_1b8[0] = '\0';
  local_1b8[1] = '\0';
  local_1b8[2] = '\0';
  local_1b8[3] = '\0';
  local_1b8[4] = '\x01';
  local_1b8[5] = '\0';
  local_1b8[6] = '\0';
  local_1b8[7] = '\0';
  local_1b8[8] = '\x02';
  local_1b8[9] = '\0';
  local_1b8[10] = '\0';
  local_1b8[0xb] = '\0';
  local_1b8[0xc] = '\x03';
  local_1b8[0xd] = '\0';
  local_1b8[0xe] = '\0';
  local_1b8[0xf] = '\0';
  local_1b8[0x10] = '\x04';
  local_1b8[0x11] = '\0';
  local_1b8[0x12] = '\0';
  local_1b8[0x13] = '\0';
  local_1d8[0] = 0;
  local_1d8[1] = 1;
  local_1d8[2] = 0;
  local_1d8[3] = 3;
  local_1d8[4] = 4;
  iuutil::CmpHelperNeRange<int[5],int[5]>
            (&local_230,(iuutil *)0x337803,"b",local_1b8,(int (*) [5])local_1d8,in_R9);
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 5;
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_198,(int *)&local_208);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0x9b;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230.m_message._M_dataplus._M_p == &local_230.m_message.field_2) {
      return;
    }
  }
  else {
    paVar1 = &local_230.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_230.m_message._M_dataplus._M_p,
                      local_230.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::CmpHelperNeRange<int[5],int[5]>
              (&local_230,(iuutil *)0x337803,"b",local_1b8,(int (*) [5])local_1d8,in_R9);
    if (local_230.m_result == false) {
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 5;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_198,(int *)&local_208);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
      local_208.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_208.m_part_result.super_iuCodeMessage.m_line = 0x9d;
      local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_230.m_message._M_dataplus._M_p,
                      local_230.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::CmpHelperNeRange<int[5],int[5]>
              (&local_230,(iuutil *)0x337803,"b",local_1b8,(int (*) [5])local_1d8,in_R9);
    if (local_230.m_result == false) {
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 5;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_198,(int *)&local_208);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
      local_208.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_208.m_part_result.super_iuCodeMessage.m_line = 0x9f;
      local_208.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_230.m_message._M_dataplus._M_p,
                      local_230.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::CmpHelperNeRange<int[5],int[5]>
              (&local_230,(iuutil *)0x337803,"b",local_1b8,(int (*) [5])local_1d8,in_R9);
    if (local_230.m_result == false) {
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 5;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_198,(int *)&local_208);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
      local_208.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_208.m_part_result.super_iuCodeMessage.m_line = 0xa1;
      local_208.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_198,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230.m_message._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_230.m_message._M_dataplus._M_p,
                  local_230.m_message.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

IUTEST(SyntaxTest, NE_RANGE)
{
    int a[] = { 0, 1, 2, 3, 4 };
    int b[] = { 0, 1, 0, 3, 4 };

    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_ASSERT_NE_RANGE(a, b) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_EXPECT_NE_RANGE(a, b) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_INFORM_NE_RANGE(a, b) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_ASSUME_NE_RANGE(a, b) << size;
}